

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslationalOrderParamZ.cpp
# Opt level: O0

void __thiscall OpenMD::TranslationalOrderParamZ::processHistogram(TranslationalOrderParamZ *this)

{
  int iVar1;
  SnapshotManager *this_00;
  size_type sVar2;
  reference pvVar3;
  Snapshot *pSVar4;
  reference pvVar5;
  reference this_01;
  reference pvVar6;
  RadialDistrFunc *in_RDI;
  RealType RVar7;
  __type _Var8;
  __type _Var9;
  uint j;
  RealType nIdeal;
  RealType volSlice;
  RealType rUpper;
  RealType rLower;
  uint i;
  RealType pairDensity;
  RealType volume;
  int nPairs;
  double in_stack_ffffffffffffff88;
  int iVar10;
  Snapshot *in_stack_ffffffffffffff90;
  uint local_4c;
  uint local_24;
  
  iVar1 = RadialDistrFunc::getNPairs(in_RDI);
  this_00 = SimInfo::getSnapshotManager((in_RDI->super_StaticAnalyser).info_);
  SnapshotManager::getCurrentSnapshot(this_00);
  RVar7 = Snapshot::getVolume(in_stack_ffffffffffffff90);
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&in_RDI[1].super_StaticAnalyser.outputFilename_);
    if (sVar2 <= local_24) break;
    iVar10 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    _Var8 = std::pow<double,int>((double)in_stack_ffffffffffffff90,iVar10);
    _Var9 = std::pow<double,int>((double)in_stack_ffffffffffffff90,iVar10);
    iVar10 = *(int *)&in_RDI[1].super_StaticAnalyser.dumpFilename_.field_2;
    local_4c = 0;
    while( true ) {
      in_stack_ffffffffffffff90 = (Snapshot *)(ulong)local_4c;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[1].super_StaticAnalyser.outputFilename_,(ulong)local_24);
      pSVar4 = (Snapshot *)std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (pSVar4 <= in_stack_ffffffffffffff90) break;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[1].super_StaticAnalyser.outputFilename_,(ulong)local_24);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_4c);
      in_stack_ffffffffffffff88 =
           (double)*pvVar5 /
           (((((_Var8 - _Var9) * 12.566370614359172) / 3.0) * ((double)(iVar1 << 1) / RVar7)) /
           (double)iVar10);
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)((long)&in_RDI[1].super_StaticAnalyser.outputFilename_.field_2 + 8),
                             (ulong)local_24);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(ulong)local_4c);
      *pvVar6 = in_stack_ffffffffffffff88 + *pvVar6;
      local_4c = local_4c + 1;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void TranslationalOrderParamZ::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity = 2 * nPairs / volume;

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          4.0 * Constants::PI * (pow(rUpper, 3) - pow(rLower, 3)) / 3.0;
      RealType nIdeal = volSlice * pairDensity / nZBins_;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }